

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

void __thiscall Node::ScanVarList(Node *this,VARTYPE ThisType,VARCLASS ThisClass,int Status)

{
  VARTYPE newType;
  ostream *poVar1;
  VariableStruct *pVVar2;
  int iVar3;
  VARCLASS ThisClass_00;
  string *psVar4;
  Node *pNVar5;
  VariableStruct VStack_188;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
LAB_00108896:
  do {
    iVar3 = this->Type;
    if (iVar3 - 500U < 2) {
      if (this->Tree[0] != (Node *)0x0) {
        ScanVarList(this->Tree[0],ThisType,ThisClass,Status);
      }
      this = this->Tree[1];
    }
    else {
      if ((iVar3 == 0x3d) || (iVar3 == 0x1f2)) {
        this = this->Tree[0];
        goto LAB_00108896;
      }
      if (iVar3 != 0x10f) {
        if (iVar3 == 0x1cd) {
          psVar4 = &this->TextValue;
          pVVar2 = VariableList::Lookup(Variables,psVar4,this->Tree[0],0);
          if (pVVar2 == (VariableStruct *)0x0) {
            if (ThisType == VARTYPE_NONE) {
              std::__cxx11::string::string((string *)&local_90,(string *)psVar4);
              ThisType = GuessVarType(&local_90);
              std::__cxx11::string::~string((string *)&local_90);
            }
            std::__cxx11::string::string((string *)&local_b0,(string *)psVar4);
            VariableStruct::VariableStruct(&VStack_188,&local_b0,ThisType,ThisClass,Status,0);
            std::__cxx11::string::~string((string *)&local_b0);
            VariableList::Append(Variables,&VStack_188,0);
            VariableStruct::~VariableStruct(&VStack_188);
          }
          if (this->Tree[0] == (Node *)0x0) {
            return;
          }
          VariableScanOne(this->Tree[0],0);
          return;
        }
        if (iVar3 == 0x1d3) {
          psVar4 = &this->TextValue;
          pVVar2 = VariableList::Lookup(Variables,psVar4,this->Tree[0],0);
          if (pVVar2 != (VariableStruct *)0x0) {
            return;
          }
          if (ThisType == VARTYPE_NONE) {
            std::__cxx11::string::string((string *)&local_d0,(string *)psVar4);
            ThisType = GuessVarType(&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
          }
          std::__cxx11::string::string((string *)&local_f0,(string *)psVar4);
          VariableStruct::VariableStruct(&VStack_188,&local_f0,ThisType,ThisClass,Status,0);
          std::__cxx11::string::~string((string *)&local_f0);
          VariableList::Append(Variables,&VStack_188,0);
          VariableStruct::~VariableStruct(&VStack_188);
          return;
        }
        if (iVar3 == 0x1d8) {
          newType = ScanType(this->Tree[1]);
          if (this->Tree[0] != (Node *)0x0) {
            pVVar2 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
            if (pVVar2 == (VariableStruct *)0x0) {
              pNVar5 = this->Tree[2];
              std::__cxx11::string::string((string *)&local_50,(string *)&this->Tree[0]->TextValue);
              VariableStruct::VariableStruct
                        (&VStack_188,&local_50,newType,(uint)(pNVar5 != (Node *)0x0),Status,0);
              std::__cxx11::string::~string((string *)&local_50);
              VariableList::Append(Variables,&VStack_188,0);
              VariableStruct::~VariableStruct(&VStack_188);
            }
            else {
              pVVar2->Class = VARCLASS_NONE;
              pVVar2->Type = newType;
            }
          }
          pNVar5 = this->Tree[2];
          ThisClass_00 = ThisClass;
          iVar3 = Status;
          if (pNVar5 == (Node *)0x0) goto LAB_00108c15;
        }
        else {
          if (iVar3 != 0x1d9) {
            return;
          }
          if (this->Tree[1] == (Node *)0x0) {
            poVar1 = std::operator<<((ostream *)&std::cerr,
                                     "Scanning: Type = NULL in BAS_V_DEFINEFUN");
            std::endl<char,std::char_traits<char>>(poVar1);
            newType = VARTYPE_NONE;
          }
          else {
            newType = ScanType(this->Tree[1]);
          }
          if (this->Tree[0] != (Node *)0x0) {
            pVVar2 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
            if (pVVar2 == (VariableStruct *)0x0) {
              std::__cxx11::string::string((string *)&local_70,(string *)&this->Tree[0]->TextValue);
              VariableStruct::VariableStruct(&VStack_188,&local_70,newType,VARCLASS_FUNC,Status,0);
              std::__cxx11::string::~string((string *)&local_70);
              VariableList::Append(Variables,&VStack_188,1);
              VariableStruct::~VariableStruct(&VStack_188);
            }
            else {
              pVVar2->Class = VARCLASS_FUNC;
              pVVar2->Type = newType;
            }
          }
          pNVar5 = this->Tree[2];
          if (pNVar5 == (Node *)0x0) goto LAB_00108c15;
          ThisClass_00 = VARCLASS_NONE;
          iVar3 = 1;
        }
        ScanVarList(pNVar5,newType,ThisClass_00,iVar3);
LAB_00108c15:
        if (this->Block[0] == (Node *)0x0) {
          return;
        }
        ScanVarList(this->Block[0],newType,ThisClass,Status);
        return;
      }
      this = this->Tree[0];
      Status = 0;
    }
    if (this == (Node *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Node::ScanVarList(
	VARTYPE ThisType,	/**< This type */
	VARCLASS ThisClass,	/**< This class */
	int Status		/**< This status */
)
{
	VariableStruct* ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:
	case BAS_N_ASSIGNLIST:

		if (Tree[0] != 0)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanVarList(ThisType, ThisClass, Status);
		}
		break;

	case '=':
	case BAS_N_ASSIGN:

		Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		break;

	case BAS_V_DEFINEVAR:

		ThisType = Tree[1]->ScanType();

		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				VARCLASS ThisClass = VARCLASS_NONE;
				if (Tree[2] != 0)
				{
					ThisClass = VARCLASS_ARRAY;
				}

				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, ThisClass, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, false);
			}
			else
			{
				ThisVar->Class =VARCLASS_NONE;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, ThisClass, Status);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_DEFINEFUN:

		if (Tree[1] != 0)
		{
			ThisType = Tree[1]->ScanType();
		}
		else
		{
			std::cerr << "Scanning: Type = NULL in BAS_V_DEFINEFUN" << std::endl;
			ThisType = VARTYPE_NONE;
		}
		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, VARCLASS_FUNC, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, true);
			}
			else
			{
				ThisVar->Class = VARCLASS_FUNC;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, VARCLASS_NONE, true);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	case BAS_V_FUNCTION:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		if (Tree[0] != NULL)
		{
			Tree[0]->VariableScanOne(false);
		}
		break;

	case BAS_S_BY:
		if (Tree[0] != NULL)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, false);
		}
		break;

	case BAS_V_NAME:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		break;
	}
}